

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::
CreateTextureImpl<Diligent::RESOURCE_STATE,VkImage_T*>
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,ITexture **ppTexture,
          TextureDesc *TexDesc,RESOURCE_STATE *ExtraArgs,VkImage_T **ExtraArgs_1)

{
  anon_class_40_5_61a70295 ConstructObject;
  ITexture **local_8;
  
  ConstructObject.TexDesc = TexDesc;
  ConstructObject.this = this;
  ConstructObject.ExtraArgs = ExtraArgs;
  ConstructObject._24_8_ = ExtraArgs_1;
  ConstructObject.ppTexture = &local_8;
  local_8 = ppTexture;
  CreateDeviceObject<Diligent::ITexture,Diligent::TextureDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateTextureImpl<Diligent::RESOURCE_STATE,VkImage_T*>(Diligent::ITexture**,Diligent::TextureDesc_const&,Diligent::RESOURCE_STATE_const&,VkImage_T*const&)::_lambda()_1_>
            (this,"Texture",TexDesc,ppTexture,ConstructObject);
  return;
}

Assistant:

void CreateTextureImpl(ITexture** ppTexture, const TextureDesc& TexDesc, const ExtraArgsType&... ExtraArgs)
    {
        CreateDeviceObject("Texture", TexDesc, ppTexture,
                           [&]() //
                           {
                               TextureImplType* pTextureImpl = NEW_RC_OBJ(m_TexObjAllocator, "Texture instance", TextureImplType)(m_TexViewObjAllocator, static_cast<RenderDeviceImplType*>(this), TexDesc, ExtraArgs...);
                               pTextureImpl->QueryInterface(IID_Texture, reinterpret_cast<IObject**>(ppTexture));
                               pTextureImpl->CreateDefaultViews();
                           });
    }